

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

value * __thiscall cppcms::json::value::find(value *this,char *cpath)

{
  int iVar1;
  size_t sVar2;
  _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
  *this_00;
  const_iterator cVar3;
  _Alloc_hider _Var4;
  char *pcVar5;
  size_t pos;
  ulong uVar6;
  bool bVar7;
  string_key path;
  string_key part;
  
  path.end_ = cpath + -1;
  do {
    pcVar5 = path.end_ + 1;
    path.end_ = path.end_ + 1;
  } while (*pcVar5 != '\0');
  path.key_._M_dataplus._M_p = (pointer)&path.key_.field_2;
  path.key_._M_string_length = 0;
  path.key_.field_2._M_local_buf[0] = '\0';
  path.begin_ = cpath;
  if ((find(char_const*)::empty == '\0') &&
     (iVar1 = __cxa_guard_acquire(&find(char_const*)::empty), iVar1 != 0)) {
    copyable::copyable(&find::empty.d);
    __cxa_atexit(~value,&find::empty,&__dso_handle);
    __cxa_guard_release(&find(char_const*)::empty);
  }
  pos = 0;
  while( true ) {
    sVar2 = string_key::find(&path,'.',pos);
    string_key::unowned_substr(&part,&path,pos,sVar2 - pos);
    uVar6 = sVar2 + 1;
    if (sVar2 + 1 == 0) {
      uVar6 = 0xffffffffffffffff;
    }
    _Var4._M_p = part.begin_;
    pcVar5 = part.end_;
    if (part.begin_ == (char *)0x0) {
      _Var4 = part.key_._M_dataplus;
      pcVar5 = part.key_._M_dataplus._M_p + part.key_._M_string_length;
    }
    if ((pcVar5 == _Var4._M_p) || (*(int *)&(*(_Base_ptr *)this)[1]._M_left != 5)) {
      bVar7 = false;
    }
    else {
      this_00 = &object(this)->_M_t;
      cVar3 = std::
              _Rb_tree<cppcms::string_key,_std::pair<const_cppcms::string_key,_cppcms::json::value>,_std::_Select1st<std::pair<const_cppcms::string_key,_cppcms::json::value>_>,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
              ::find(this_00,&part);
      bVar7 = (_Rb_tree_header *)cVar3._M_node != &(this_00->_M_impl).super__Rb_tree_header;
      if (bVar7) {
        pos = uVar6;
        this = (value *)&cVar3._M_node[2]._M_left;
      }
    }
    std::__cxx11::string::~string((string *)&part.key_);
    if (!bVar7) break;
    _Var4._M_p = path.begin_;
    pcVar5 = path.end_;
    if (path.begin_ == (char *)0x0) {
      _Var4 = path.key_._M_dataplus;
      pcVar5 = path.key_._M_dataplus._M_p + path.key_._M_string_length;
    }
    if ((ulong)((long)pcVar5 - (long)_Var4._M_p) <= uVar6) {
LAB_0010a7ba:
      std::__cxx11::string::~string((string *)&path.key_);
      return (value *)(_Base_ptr *)this;
    }
  }
  this = &find::empty;
  goto LAB_0010a7ba;
}

Assistant:

value const &value::find(char const *cpath) const
	{
		string_key path=string_key::unowned(cpath);
		static value const empty;
		value const *ptr=this;
		size_t pos=0;
		size_t new_pos;
		do {
			new_pos=path.find('.',pos);
			string_key const part=path.unowned_substr(pos,new_pos - pos);
			if(new_pos!=std::string::npos)
				new_pos++;
			if(part.empty())
				return empty;
			if(ptr->type()!=json::is_object)
				return empty;
			json::object const &obj=ptr->object();
			json::object::const_iterator p;
			if((p=obj.find(part))==obj.end())
				return empty;
			ptr=&p->second;
			pos=new_pos;

		} while(new_pos < path.size());
		return *ptr;
	}